

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateRSTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::DynamicState::anon_unknown_0::DepthBiasBaseCase::iterate
          (TestStatus *__return_storage_ptr__,DepthBiasBaseCase *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Should reimplement iterate() method",&local_31);
  tcu::TestStatus::fail(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual tcu::TestStatus iterate (void)
	{
		DE_ASSERT(false);
		return tcu::TestStatus::fail("Should reimplement iterate() method");
	}